

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_fontdef_tt.c
# Opt level: O2

void UINT32Swap(HPDF_UINT32 *value)

{
  undefined8 in_RAX;
  HPDF_BYTE b [4];
  
  b = SUB84((ulong)in_RAX >> 0x20,0);
  HPDF_MemCpy(b,(HPDF_BYTE *)value,4);
  *value = (uint)b >> 0x18 | ((uint)b & 0xff0000) >> 8 | ((uint)b & 0xff00) << 8 | (int)b << 0x18;
  return;
}

Assistant:

static void
UINT32Swap (HPDF_UINT32  *value)
{
    HPDF_BYTE b[4];

    HPDF_MemCpy (b, (HPDF_BYTE *)value, 4);
    *value = (HPDF_UINT32)((HPDF_UINT32)b[0] << 24 |
             (HPDF_UINT32)b[1] << 16 |
             (HPDF_UINT32)b[2] << 8 |
             (HPDF_UINT32)b[3]);
}